

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O0

void __thiscall QtMWidgets::Stepper::Stepper(Stepper *this,QWidget *parent)

{
  StepperPrivate *pSVar1;
  Object local_38 [8];
  QSizePolicy local_30 [5];
  QFlags<Qt::WindowType> local_1c;
  QWidget *local_18;
  QWidget *parent_local;
  Stepper *this_local;
  
  local_18 = parent;
  parent_local = &this->super_QWidget;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_00235208;
  *(undefined ***)&this->field_0x10 = &PTR__Stepper_002353b8;
  pSVar1 = (StepperPrivate *)operator_new(0x48);
  StepperPrivate::StepperPrivate(pSVar1,this);
  QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>::
  QScopedPointer(&this->d,pSVar1);
  QSizePolicy::QSizePolicy(local_30,Fixed,Fixed,DefaultType);
  QWidget::setSizePolicy((QSizePolicy)SUB84(this,0));
  pSVar1 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  QObject::connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QtMWidgets::Stepper::*)()>
            (local_38,(offset_in_QTimer_to_subr)pSVar1->timer,(Object *)QTimer::timeout,0,
             (ConnectionType)SUB84(this,0));
  QMetaObject::Connection::~Connection((Connection *)local_38);
  return;
}

Assistant:

Stepper::Stepper( QWidget * parent )
	:	QWidget( parent )
	,	d( new StepperPrivate( this ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed, QSizePolicy::Fixed ) );

	connect( d->timer, &QTimer::timeout,
		this, &Stepper::_q_autorepeat );
}